

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O3

Image * Image_Function_Helper::Merge
                  (Image *__return_storage_ptr__,MergeForm4 merge,Image *in1,Image *in2,Image *in3)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in1,in2,in3);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in1,in1->_width,in1->_height,'\x03','\x01');
  (*merge)(in1,0,0,in2,0,0,in3,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
           __return_storage_ptr__->_height);
  return __return_storage_ptr__;
}

Assistant:

Image Merge( FunctionTable::MergeForm4 merge,
                 const Image & in1, const Image & in2, const Image & in3 )
    {
        Image_Function::ParameterValidation( in1, in2, in3 );

        Image out = in1.generate( in1.width(), in1.height(), RGB );

        merge( in1, 0, 0, in2, 0, 0, in3, 0, 0, out, 0, 0, out.width(), out.height() );

        return out;
    }